

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  uchar *puVar3;
  int *piVar4;
  uchar *data;
  long lVar5;
  int iVar6;
  long lVar7;
  size_t __size;
  int *two_back;
  int iVar8;
  long in_FS_OFFSET;
  size_t local_8998;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  two_back = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    *(char **)(in_FS_OFFSET + -0x20) = "not GIF";
    data = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_8998 = 4;
    lVar5 = 0;
    lVar7 = 0;
    data = (uchar *)0x0;
    while( true ) {
      __src = (stbi__context *)
              stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar7,(stbi_uc *)two_back);
      iVar2 = (int)lVar5;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar6 = local_88a0.h * local_88a0.w;
      iVar1 = iVar6 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (data == (uchar *)0x0) {
        puVar3 = (uchar *)malloc(__size);
        if (puVar3 != (uchar *)0x0) {
          if (delays != (int **)0x0) {
            piVar4 = (int *)malloc(local_8998);
            *delays = piVar4;
            data = puVar3;
            if (piVar4 == (int *)0x0) goto LAB_00102b55;
          }
          goto LAB_00102a6d;
        }
        stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
LAB_00102b76:
        data = (uchar *)0x0;
        goto LAB_00102b7b;
      }
      puVar3 = (uchar *)realloc(data,__size);
      if (puVar3 == (uchar *)0x0) {
LAB_00102b55:
        stbi__load_gif_main_outofmem(&local_88a0,data,delays);
        goto LAB_00102b76;
      }
      if (delays != (int **)0x0) {
        piVar4 = (int *)realloc(*delays,local_8998);
        data = puVar3;
        if (piVar4 == (int *)0x0) goto LAB_00102b55;
        *delays = piVar4;
      }
LAB_00102a6d:
      memcpy(puVar3 + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar5 != 0) {
        lVar7 = (long)puVar3 - (long)(iVar6 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar5] = local_88a0.delay;
      }
      local_8998 = local_8998 + 4;
      lVar5 = lVar5 + 1;
      data = puVar3;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      data = stbi__convert_format(data,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_00102b7b:
  iVar2 = stbi__vertically_flip_on_load_global;
  if (*(int *)(in_FS_OFFSET + -0x14) != 0) {
    iVar2 = *(int *)(in_FS_OFFSET + -0x18);
  }
  if (iVar2 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar6 = *comp;
    puVar3 = data;
    iVar8 = 0;
    if (0 < *z) {
      iVar8 = *z;
    }
    while (iVar8 != 0) {
      stbi__vertical_flip(puVar3,iVar2,iVar1,iVar6);
      puVar3 = puVar3 + iVar1 * iVar2 * iVar6;
      iVar8 = iVar8 + -1;
    }
  }
  return data;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}